

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmu-hash64.c
# Opt level: O1

void ppc_hash64_filter_pagesizes
               (PowerPCCPU_conflict3 *cpu,_func__Bool_void_ptr_uint32_t_uint32_t *cb,void *opaque)

{
  PPCHash64PageSize *pPVar1;
  PPCHash64SegmentPageSizes *pPVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  PPCHash64Options *pPVar5;
  _Bool _Var6;
  bool bVar7;
  uint uVar8;
  long lVar9;
  uint uVar10;
  long lVar11;
  ulong uVar12;
  PPCHash64PageSize *pPVar13;
  bool bVar14;
  
  pPVar5 = cpu->hash64_opts;
  if (pPVar5 == (PPCHash64Options *)0x0) {
    __assert_fail("opts",
                  "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/ppc/mmu-hash64.c"
                  ,0x4db,
                  "void ppc_hash64_filter_pagesizes(PowerPCCPU *, _Bool (*)(void *, uint32_t, uint32_t), void *)"
                 );
  }
  pPVar1 = pPVar5->sps[0].enc;
  lVar9 = 0;
  uVar8 = 0;
  bVar7 = false;
  pPVar13 = pPVar1;
  do {
    if (lVar9 < (int)uVar8) {
      __assert_fail("n <= i",
                    "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/ppc/mmu-hash64.c"
                    ,0x4e3,
                    "void ppc_hash64_filter_pagesizes(PowerPCCPU *, _Bool (*)(void *, uint32_t, uint32_t), void *)"
                   );
    }
    pPVar2 = pPVar5->sps + lVar9;
    uVar3 = pPVar2->page_shift;
    if (uVar3 != 0) {
      uVar10 = 0;
      uVar12 = 0;
      do {
        lVar11 = (long)(int)uVar10;
        if ((long)uVar12 < lVar11) {
          __assert_fail("m <= j",
                        "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/ppc/mmu-hash64.c"
                        ,0x4ec,
                        "void ppc_hash64_filter_pagesizes(PowerPCCPU *, _Bool (*)(void *, uint32_t, uint32_t), void *)"
                       );
        }
        uVar4 = pPVar13[uVar12].page_shift;
        if (uVar4 != 0) {
          _Var6 = (*cb)(opaque,pPVar2->page_shift,uVar4);
          if (_Var6) {
            if (0xf < pPVar13[uVar12].page_shift) {
              bVar7 = true;
            }
            uVar10 = uVar10 + 1;
            pPVar2->enc[lVar11] = pPVar13[uVar12];
          }
        }
      } while ((uVar4 != 0) && (bVar14 = uVar12 < 7, uVar12 = uVar12 + 1, bVar14));
      if (uVar10 < 8) {
        memset((void *)((long)&pPVar1[lVar9 * 9].page_shift + (ulong)(uVar10 * 8)),0,
               (ulong)(uVar10 * -8 + 0x40));
      }
      uVar8 = (uVar8 + 1) - (uint)(uVar10 == 0);
    }
    if (uVar3 == 0) break;
    lVar9 = lVar9 + 1;
    pPVar13 = pPVar13 + 9;
  } while (lVar9 != 8);
  if (uVar8 < 8) {
    memset((void *)((long)&((PPCHash64SegmentPageSizes *)(pPVar5->sps[0].enc + -1))->page_shift +
                   (ulong)(uVar8 * 0x48)),0,(ulong)((7 - uVar8) * 0x48 + 0x48));
  }
  if (!bVar7) {
    *(byte *)&pPVar5->flags = (byte)pPVar5->flags & 0xfb;
  }
  return;
}

Assistant:

void ppc_hash64_filter_pagesizes(PowerPCCPU *cpu,
                                 bool (*cb)(void *, uint32_t, uint32_t),
                                 void *opaque)
{
    PPCHash64Options *opts = cpu->hash64_opts;
    int i;
    int n = 0;
    bool ci_largepage = false;

    assert(opts);

    n = 0;
    for (i = 0; i < ARRAY_SIZE(opts->sps); i++) {
        PPCHash64SegmentPageSizes *sps = &opts->sps[i];
        int j;
        int m = 0;

        assert(n <= i);

        if (!sps->page_shift) {
            break;
        }

        for (j = 0; j < ARRAY_SIZE(sps->enc); j++) {
            PPCHash64PageSize *ps = &sps->enc[j];

            assert(m <= j);
            if (!ps->page_shift) {
                break;
            }

            if (cb(opaque, sps->page_shift, ps->page_shift)) {
                if (ps->page_shift >= 16) {
                    ci_largepage = true;
                }
                sps->enc[m++] = *ps;
            }
        }

        /* Clear rest of the row */
        for (j = m; j < ARRAY_SIZE(sps->enc); j++) {
            memset(&sps->enc[j], 0, sizeof(sps->enc[j]));
        }

        if (m) {
            n++;
        }
    }

    /* Clear the rest of the table */
    for (i = n; i < ARRAY_SIZE(opts->sps); i++) {
        memset(&opts->sps[i], 0, sizeof(opts->sps[i]));
    }

    if (!ci_largepage) {
        opts->flags &= ~PPC_HASH64_CI_LARGEPAGE;
    }
}